

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udatamem.cpp
# Opt level: O0

int32_t udata_getLength_63(UDataMemory *pData)

{
  int iVar1;
  uint16_t uVar2;
  UDataMemory *pData_local;
  
  if (((pData == (UDataMemory *)0x0) || (pData->pHeader == (DataHeader *)0x0)) ||
     (pData->length < 0)) {
    pData_local._4_4_ = -1;
  }
  else {
    iVar1 = pData->length;
    uVar2 = udata_getHeaderSize_63(pData->pHeader);
    pData_local._4_4_ = iVar1 - (uint)uVar2;
  }
  return pData_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_getLength(const UDataMemory *pData) {
    if(pData!=NULL && pData->pHeader!=NULL && pData->length>=0) {
        /*
         * subtract the header size,
         * return only the size of the actual data starting at udata_getMemory()
         */
        return pData->length-udata_getHeaderSize(pData->pHeader);
    } else {
        return -1;
    }
}